

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  _Base_ptr *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  undefined8 *puVar4;
  once_flag *__once;
  bool bVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  _Rb_tree_header *p_Var10;
  long lVar11;
  Descriptor *this_00;
  int *piVar12;
  long lVar13;
  long lVar14;
  SubstituteArg local_3b8;
  vector<int,_std::allocator<int>_> path;
  vector<int,_std::allocator<int>_> path_1;
  SubstituteArg local_340;
  SubstituteArg local_310;
  SubstituteArg local_2e0;
  SubstituteArg local_2b0;
  SubstituteArg local_280;
  SubstituteArg local_250;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  _Alloc_hider local_1e8;
  char local_1d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  _Alloc_hider local_1a8;
  char local_198 [16];
  SubstituteArg local_188;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  SourceLocationCommentPrinter comment_printer;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  SubstituteArg local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  comment_printer.have_source_loc_ = true;
  comment_printer._1_3_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&path,(iterator)0x0,(int *)&comment_printer);
  pp_Var1 = &groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  groups._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&groups,"");
  anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            (&comment_printer,this,&path,(string *)&groups,debug_string_options);
  if ((_Base_ptr *)groups._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)groups._M_t._M_impl._0_8_);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  groups._M_t._M_impl._0_8_ = SyntaxName((uint)(byte)this[0x3a]);
  sVar6 = strlen((char *)groups._M_t._M_impl._0_8_);
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)sVar6;
  public_dependencies._M_t._M_impl._0_8_ = 0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  weak_dependencies._M_t._M_impl._0_8_ = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  local_3b8.text_ = (char *)0x0;
  local_3b8.size_ = -1;
  local_2b0.text_ = (char *)0x0;
  local_2b0.size_ = -1;
  local_250.text_ = (char *)0x0;
  local_250.size_ = -1;
  local_280.text_ = (char *)0x0;
  local_280.size_ = -1;
  local_2e0.text_ = (char *)0x0;
  local_2e0.size_ = -1;
  local_310.text_ = (char *)0x0;
  local_310.size_ = -1;
  local_340.text_ = (char *)0x0;
  local_340.size_ = -1;
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"syntax = \"$0\";\n\n",(SubstituteArg *)&groups,
             (SubstituteArg *)&public_dependencies,(SubstituteArg *)&weak_dependencies,&local_3b8,
             &local_2b0,&local_250,&local_280,&local_2e0,&local_310,&local_340);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  pp_Var1 = &groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p);
  }
  paVar2 = &comment_printer.source_loc_.leading_comments.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p != paVar2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p);
  }
  if (path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  groups._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&groups,"");
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&comment_printer.prefix_,groups._M_t._M_impl._0_8_,
             CONCAT44(groups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
             groups._M_t._M_impl._0_8_);
  if (debug_string_options->include_comments == true) {
    bVar5 = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    bVar5 = false;
  }
  comment_printer.have_source_loc_ = bVar5;
  if ((_Base_ptr *)groups._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)groups._M_t._M_impl._0_8_);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  p_Var3 = &public_dependencies._M_t._M_impl.super__Rb_tree_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar12 = *(int **)(this + 0x48);
  groups._M_t._M_impl._0_8_ = &public_dependencies;
  if ((long)*(int *)(this + 0x24) != 0) {
    lVar11 = (long)*(int *)(this + 0x24) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &public_dependencies,(const_iterator)p_Var3,piVar12,(_Alloc_node *)&groups);
      piVar12 = piVar12 + 1;
      lVar11 = lVar11 + -4;
    } while (lVar11 != 0);
  }
  piVar12 = *(int **)(this + 0x50);
  groups._M_t._M_impl._0_8_ = &weak_dependencies;
  if ((long)*(int *)(this + 0x28) != 0) {
    lVar11 = (long)*(int *)(this + 0x28) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &weak_dependencies,
                 (const_iterator)&weak_dependencies._M_t._M_impl.super__Rb_tree_header,piVar12,
                 (_Alloc_node *)&groups);
      piVar12 = piVar12 + 1;
      lVar11 = lVar11 + -4;
    } while (lVar11 != 0);
  }
  if (0 < *(int *)(this + 0x20)) {
    lVar11 = 0;
    p_Var7 = &p_Var3->_M_header;
    p_Var8 = public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
          p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < lVar11]) {
        if (lVar11 <= (int)*(size_t *)(p_Var8 + 1)) {
          p_Var7 = p_Var8;
        }
      }
      p_Var10 = p_Var3;
      if (((_Rb_tree_header *)p_Var7 != p_Var3) &&
         (p_Var10 = (_Rb_tree_header *)p_Var7,
         lVar11 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
        p_Var10 = p_Var3;
      }
      local_3b8.text_ = (char *)this;
      if (p_Var10 == p_Var3) {
        p_Var7 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
        for (p_Var8 = weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
            p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < lVar11]) {
          if (lVar11 <= (int)*(size_t *)(p_Var8 + 1)) {
            p_Var7 = p_Var8;
          }
        }
        p_Var10 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = p_Var10;
        if (((_Rb_tree_header *)p_Var7 != p_Var10) &&
           (p_Var9 = (_Rb_tree_header *)p_Var7,
           lVar11 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var9 = p_Var10;
        }
        if (p_Var9 == p_Var10) {
          if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
            std::
            call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                      (*(once_flag **)(this + 0x18),DependenciesOnceInit,
                       (FileDescriptor **)&local_3b8);
          }
          puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x40) + lVar11 * 8);
          groups._M_t._M_impl._0_8_ = *puVar4;
          groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               *(_Rb_tree_color *)(puVar4 + 1);
          local_3b8.text_ = (char *)0x0;
          local_3b8.size_ = -1;
          local_2b0.text_ = (char *)0x0;
          local_2b0.size_ = -1;
          local_250.text_ = (char *)0x0;
          local_250.size_ = -1;
          local_280.text_ = (char *)0x0;
          local_280.size_ = -1;
          local_2e0.text_ = (char *)0x0;
          local_2e0.size_ = -1;
          local_310.text_ = (char *)0x0;
          local_310.size_ = -1;
          local_340.text_ = (char *)0x0;
          local_340.size_ = -1;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish._4_4_,0xffffffff);
          local_188.text_ = (char *)0x0;
          local_188.size_ = -1;
          strings::SubstituteAndAppend
                    (__return_storage_ptr__,"import \"$0\";\n",(SubstituteArg *)&groups,&local_3b8,
                     &local_2b0,&local_250,&local_280,&local_2e0,&local_310,&local_340,
                     (SubstituteArg *)&path,&local_188);
        }
        else {
          if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
            std::
            call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                      (*(once_flag **)(this + 0x18),DependenciesOnceInit,
                       (FileDescriptor **)&local_3b8);
          }
          puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x40) + lVar11 * 8);
          groups._M_t._M_impl._0_8_ = *puVar4;
          groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               *(_Rb_tree_color *)(puVar4 + 1);
          local_3b8.text_ = (char *)0x0;
          local_3b8.size_ = -1;
          local_2b0.text_ = (char *)0x0;
          local_2b0.size_ = -1;
          local_250.text_ = (char *)0x0;
          local_250.size_ = -1;
          local_280.text_ = (char *)0x0;
          local_280.size_ = -1;
          local_2e0.text_ = (char *)0x0;
          local_2e0.size_ = -1;
          local_310.text_ = (char *)0x0;
          local_310.size_ = -1;
          local_340.text_ = (char *)0x0;
          local_340.size_ = -1;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish._4_4_,0xffffffff);
          local_188.text_ = (char *)0x0;
          local_188.size_ = -1;
          strings::SubstituteAndAppend
                    (__return_storage_ptr__,"import weak \"$0\";\n",(SubstituteArg *)&groups,
                     &local_3b8,&local_2b0,&local_250,&local_280,&local_2e0,&local_310,&local_340,
                     (SubstituteArg *)&path,&local_188);
        }
      }
      else {
        if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
          std::
          call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                    (*(once_flag **)(this + 0x18),DependenciesOnceInit,(FileDescriptor **)&local_3b8
                    );
        }
        puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x40) + lVar11 * 8);
        groups._M_t._M_impl._0_8_ = *puVar4;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar4 + 1);
        local_3b8.text_ = (char *)0x0;
        local_3b8.size_ = -1;
        local_2b0.text_ = (char *)0x0;
        local_2b0.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        local_280.text_ = (char *)0x0;
        local_280.size_ = -1;
        local_2e0.text_ = (char *)0x0;
        local_2e0.size_ = -1;
        local_310.text_ = (char *)0x0;
        local_310.size_ = -1;
        local_340.text_ = (char *)0x0;
        local_340.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_188.text_ = (char *)0x0;
        local_188.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import public \"$0\";\n",(SubstituteArg *)&groups,
                   &local_3b8,&local_2b0,&local_250,&local_280,&local_2e0,&local_310,&local_340,
                   (SubstituteArg *)&path,&local_188);
      }
      lVar11 = lVar11 + 1;
      p_Var7 = &p_Var3->_M_header;
      p_Var8 = public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while (lVar11 < *(int *)(this + 0x20));
  }
  if (*(long *)(*(long *)(this + 8) + 8) != 0) {
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    groups._M_t._M_impl._0_4_ = 2;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&path_1,(iterator)0x0,(int *)&groups);
    local_3b8.text_ = local_3b8.scratch_ + 4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
    anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)&groups,this,&path_1,(string *)&local_3b8,
               debug_string_options);
    if (local_3b8.text_ != local_3b8.scratch_ + 4) {
      operator_delete(local_3b8.text_);
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    local_3b8.text_ = (char *)**(undefined8 **)(this + 8);
    local_3b8.size_ = *(int *)(*(undefined8 **)(this + 8) + 1);
    local_2b0.text_ = (char *)0x0;
    local_2b0.size_ = -1;
    local_250.text_ = (char *)0x0;
    local_250.size_ = -1;
    local_280.text_ = (char *)0x0;
    local_280.size_ = -1;
    local_2e0.text_ = (char *)0x0;
    local_2e0.size_ = -1;
    local_310.text_ = (char *)0x0;
    local_310.size_ = -1;
    local_340.text_ = (char *)0x0;
    local_340.size_ = -1;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,0xffffffff);
    local_188.text_ = (char *)0x0;
    local_188.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",&local_3b8,&local_2b0,&local_250,&local_280,
               &local_2e0,&local_310,&local_340,(SubstituteArg *)&path,&local_188,&local_60);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    if (local_1a8._M_p != local_198) {
      operator_delete(local_1a8._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    if (local_1e8._M_p != local_1d8) {
      operator_delete(local_1e8._M_p);
    }
    if (groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        (_Base_ptr)&groups._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      operator_delete(groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    }
    if (path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  bVar5 = anon_unknown_1::FormatLineOptions
                    (0,*(Message **)(this + 0x78),*(DescriptorPool **)(this + 0x10),
                     __return_storage_ptr__);
  if (bVar5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (0 < *(int *)(this + 0x30)) {
    lVar11 = 0;
    lVar14 = 0;
    do {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(*(long *)(this + 0x60) + lVar11),0,__return_storage_ptr__,
                 debug_string_options);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0x48;
    } while (lVar14 < *(int *)(this + 0x30));
  }
  p_Var3 = &groups._M_t._M_impl.super__Rb_tree_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  if (0 < *(int *)(this + 0x3c)) {
    lVar11 = 0;
    lVar14 = 0;
    do {
      lVar13 = *(long *)(this + 0x70);
      __once = *(once_flag **)(lVar13 + 0x18 + lVar11);
      if (__once != (once_flag *)0x0) {
        local_2b0.text_ = (char *)(lVar11 + lVar13);
        local_3b8.text_ = (char *)FieldDescriptor::TypeOnceInit;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,(_func_void_FieldDescriptor_ptr **)&local_3b8,
                   (FieldDescriptor **)&local_2b0);
      }
      if (*(char *)(lVar13 + 2 + lVar11) == '\n') {
        local_3b8.text_ =
             (char *)FieldDescriptor::message_type
                               ((FieldDescriptor *)(*(long *)(this + 0x70) + lVar11));
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)&local_3b8);
      }
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0x48;
    } while (lVar14 < *(int *)(this + 0x3c));
  }
  if (0 < *(int *)(this + 0x2c)) {
    lVar11 = 0;
    do {
      this_00 = (Descriptor *)(lVar11 * 0x88 + *(long *)(this + 0x58));
      p_Var8 = &p_Var3->_M_header;
      for (p_Var7 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
          p_Var7 = (&p_Var7->_M_left)[*(Descriptor **)(p_Var7 + 1) < this_00]) {
        if (*(Descriptor **)(p_Var7 + 1) >= this_00) {
          p_Var8 = p_Var7;
        }
      }
      p_Var10 = p_Var3;
      if (((_Rb_tree_header *)p_Var8 != p_Var3) &&
         (p_Var10 = (_Rb_tree_header *)p_Var8,
         this_00 < (Descriptor *)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
        p_Var10 = p_Var3;
      }
      if (p_Var10 == p_Var3) {
        Descriptor::DebugString(this_00,0,__return_storage_ptr__,debug_string_options,true);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)(this + 0x2c));
  }
  if (0 < *(int *)(this + 0x34)) {
    lVar11 = 0;
    lVar14 = 0;
    do {
      ServiceDescriptor::DebugString
                ((ServiceDescriptor *)(*(long *)(this + 0x68) + lVar11),__return_storage_ptr__,
                 debug_string_options);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0x30;
    } while (lVar14 < *(int *)(this + 0x34));
  }
  if (0 < *(int *)(this + 0x3c)) {
    lVar14 = 0;
    lVar13 = 0;
    lVar11 = 0;
    do {
      if (*(long *)(*(long *)(this + 0x70) + 0x20 + lVar14) != lVar11) {
        if (lVar14 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        lVar11 = *(long *)(*(long *)(this + 0x70) + 0x20 + lVar14);
        local_3b8.text_ = *(char **)(*(long *)(lVar11 + 8) + 0x20);
        local_3b8.size_ = *(int *)(*(long *)(lVar11 + 8) + 0x28);
        local_2b0.text_ = (char *)0x0;
        local_2b0.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        local_280.text_ = (char *)0x0;
        local_280.size_ = -1;
        local_2e0.text_ = (char *)0x0;
        local_2e0.size_ = -1;
        local_310.text_ = (char *)0x0;
        local_310.size_ = -1;
        local_340.text_ = (char *)0x0;
        local_340.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_188.text_ = (char *)0x0;
        local_188.size_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"extend .$0 {\n",&local_3b8,&local_2b0,&local_250,
                   &local_280,&local_2e0,&local_310,&local_340,(SubstituteArg *)&path,&local_188,
                   &local_60);
      }
      FieldDescriptor::DebugString
                ((FieldDescriptor *)(*(long *)(this + 0x70) + lVar14),1,__return_storage_ptr__,
                 debug_string_options);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x48;
    } while (lVar13 < *(int *)(this + 0x3c));
    if (0 < *(int *)(this + 0x3c)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&weak_dependencies._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&public_dependencies._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.leading_comments.field_2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(this, path, "",
                                                debug_string_options);
    syntax_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                              SyntaxName(syntax()));
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  std::set<int> public_dependencies;
  std::set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(this, path, "",
                                                 debug_string_options);
    package_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  if (FormatLineOptions(0, options(), pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                containing_type->full_name());
    }
    extension(i)->DebugString(1, &contents, debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}